

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::Init
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
           *this)

{
  Arena *this_00;
  InnerMap *pIVar1;
  int local_8c;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *local_88;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *this_local;
  Allocator local_70;
  InnerMap *local_68;
  undefined1 *local_60;
  int *local_58;
  Arena *local_50;
  InnerMap *local_48;
  size_type local_40;
  InnerMap *local_38;
  InnerMap *t;
  undefined1 *local_28;
  int *local_20;
  byte local_11;
  Arena *local_10;
  
  this_00 = this->arena_;
  local_8c = 0;
  local_88 = this;
  MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
  ::MapAllocator((MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
                  *)&stack0xffffffffffffff68,this->arena_);
  local_58 = &stack0xffffffffffffff74;
  local_60 = &stack0xffffffffffffff73;
  local_68 = (InnerMap *)&stack0xffffffffffffff68;
  local_50 = this_00;
  if (this_00 == (Arena *)0x0) {
    pIVar1 = (InnerMap *)operator_new(0x30);
    local_70.arena_ = (Arena *)local_68->num_elements_;
    InnerMap::InnerMap(pIVar1,(long)*local_58,local_70.arena_);
    local_48 = pIVar1;
  }
  else {
    local_11 = 0;
    t = local_68;
    local_28 = local_60;
    local_20 = local_58;
    local_10 = this_00;
    pIVar1 = (InnerMap *)
             Arena::AllocateAligned
                       (this_00,(type_info *)&Map<std::__cxx11::string,long>::InnerMap::typeinfo,
                        0x30);
    local_40 = t->num_elements_;
    InnerMap::InnerMap(pIVar1,(long)*local_20,local_40);
    local_38 = pIVar1;
    if ((local_11 & 1) == 0) {
      Arena::AddListNode(this_00,pIVar1,
                         internal::
                         arena_destruct_object<google::protobuf::Map<std::__cxx11::string,long>::InnerMap>
                        );
    }
    local_48 = local_38;
  }
  this->elements_ = local_48;
  return;
}

Assistant:

void Init() {
    elements_ = Arena::Create<InnerMap>(arena_, 0, hasher(), Allocator(arena_));
  }